

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O2

TransformNode * __thiscall
rengine::AllocationPool<rengine::TransformNode>::allocate
          (AllocationPool<rengine::TransformNode> *this)

{
  uint uVar1;
  uint *puVar2;
  TransformNode *this_00;
  char *__assertion;
  
  uVar1 = this->m_nextFree;
  if (uVar1 < this->m_poolSize) {
    if (this->m_memory == (TransformNode *)0x0) {
      __assertion = "m_memory";
      uVar1 = 0x40;
    }
    else {
      puVar2 = this->m_free;
      if (puVar2 == (uint *)0x0) {
        __assertion = "m_free";
        uVar1 = 0x41;
      }
      else {
        if (puVar2[uVar1] < this->m_poolSize) {
          this->m_nextFree = uVar1 + 1;
          this_00 = this->m_memory + puVar2[uVar1];
          TransformNode::TransformNode(this_00);
          return this_00;
        }
        __assertion = "m_free[m_nextFree] < m_poolSize";
        uVar1 = 0x42;
      }
    }
  }
  else {
    __assertion = "!isExhausted()";
    uVar1 = 0x3f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,uVar1,
                "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }